

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomAttrPrivate * __thiscall
QDomElementPrivate::setAttributeNodeNS(QDomElementPrivate *this,QDomAttrPrivate *newAttr)

{
  bool bVar1;
  QString *in_RSI;
  QString *in_RDI;
  QDomNamedNodeMapPrivate *unaff_retaddr;
  QDomNodePrivate *n;
  QDomNodePrivate *in_stack_00000058;
  undefined8 local_18;
  
  local_18 = (QDomNodePrivate *)0x0;
  bVar1 = QString::isNull((QString *)0x116383);
  if (!bVar1) {
    local_18 = QDomNamedNodeMapPrivate::namedItemNS(unaff_retaddr,in_RDI,in_RSI);
  }
  QDomNamedNodeMapPrivate::setNamedItem(unaff_retaddr,in_stack_00000058);
  return (QDomAttrPrivate *)local_18;
}

Assistant:

QDomAttrPrivate* QDomElementPrivate::setAttributeNodeNS(QDomAttrPrivate* newAttr)
{
    QDomNodePrivate* n = nullptr;
    if (!newAttr->prefix.isNull())
        n = m_attr->namedItemNS(newAttr->namespaceURI, newAttr->name);

    // Referencing is done by the maps
    m_attr->setNamedItem(newAttr);

    return static_cast<QDomAttrPrivate *>(n);
}